

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O2

Ptr __thiscall
TgBot::TgTypeParser::parseJsonAndGetInlineQueryResultLocation(TgTypeParser *this,ptree *data)

{
  type_conflict4 tVar1;
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  float fVar2;
  Ptr PVar3;
  allocator local_89;
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  type local_38;
  
  std::make_shared<TgBot::InlineQueryResultLocation>();
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_88,"latitude",0x2e);
  fVar2 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<float>(in_RDX,&local_88);
  *(float *)(*(long *)this + 0xa8) = fVar2;
  std::__cxx11::string::~string((string *)&local_88);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_88,"longitude",0x2e);
  fVar2 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<float>(in_RDX,&local_88);
  *(float *)(*(long *)this + 0xac) = fVar2;
  std::__cxx11::string::~string((string *)&local_88);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_88,"thumb_url",0x2e);
  std::__cxx11::string::string((string *)&local_58,"",&local_89);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get<std::__cxx11::string>
            (&local_38,
             (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)in_RDX,&local_88,&local_58);
  std::__cxx11::string::operator=((string *)(*(long *)this + 0xb0),(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_88);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_88,"thumb_width",0x2e);
  local_38._M_dataplus._M_p._0_4_ = 0;
  tVar1 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<int>(in_RDX,&local_88,(int *)&local_38);
  *(type_conflict4 *)(*(long *)this + 0xd0) = tVar1;
  std::__cxx11::string::~string((string *)&local_88);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_88,"thumb_height",0x2e);
  local_38._M_dataplus._M_p._0_4_ = 0;
  tVar1 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<int>(in_RDX,&local_88,(int *)&local_38);
  *(type_conflict4 *)(*(long *)this + 0xd4) = tVar1;
  std::__cxx11::string::~string((string *)&local_88);
  PVar3.super___shared_ptr<TgBot::InlineQueryResultLocation,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = extraout_RDX._M_pi;
  PVar3.super___shared_ptr<TgBot::InlineQueryResultLocation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar3.super___shared_ptr<TgBot::InlineQueryResultLocation,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

InlineQueryResultLocation::Ptr TgTypeParser::parseJsonAndGetInlineQueryResultLocation(const boost::property_tree::ptree& data) const {
    // NOTE: This function will be called by parseJsonAndGgetInlineQueryResult().
    auto result(make_shared<InlineQueryResultLocation>());
    result->latitude = data.get<float>("latitude");
    result->longitude = data.get<float>("longitude");
    result->thumbUrl = data.get<string>("thumb_url", "");
    result->thumbWidth = data.get<int32_t>("thumb_width", 0);
    result->thumbHeight = data.get<int32_t>("thumb_height", 0);
    return result;
}